

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_hmac.c
# Opt level: O0

int drbg_hmac_new(PROV_DRBG *drbg)

{
  void *pvVar1;
  char *in_RDI;
  PROV_DRBG_HMAC *hmac;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  pvVar1 = CRYPTO_secure_zalloc
                     (CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                      (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pvVar1 != (void *)0x0) {
    *(void **)(in_RDI + 0xf8) = pvVar1;
    in_RDI[0x98] = -1;
    in_RDI[0x99] = -1;
    in_RDI[0x9a] = -1;
    in_RDI[0x9b] = '\x7f';
    in_RDI[0x9c] = '\0';
    in_RDI[0x9d] = '\0';
    in_RDI[0x9e] = '\0';
    in_RDI[0x9f] = '\0';
    in_RDI[0xa8] = -1;
    in_RDI[0xa9] = -1;
    in_RDI[0xaa] = -1;
    in_RDI[0xab] = '\x7f';
    in_RDI[0xac] = '\0';
    in_RDI[0xad] = '\0';
    in_RDI[0xae] = '\0';
    in_RDI[0xaf] = '\0';
    in_RDI[0xb0] = -1;
    in_RDI[0xb1] = -1;
    in_RDI[0xb2] = -1;
    in_RDI[0xb3] = '\x7f';
    in_RDI[0xb4] = '\0';
    in_RDI[0xb5] = '\0';
    in_RDI[0xb6] = '\0';
    in_RDI[0xb7] = '\0';
    in_RDI[0xb8] = -1;
    in_RDI[0xb9] = -1;
    in_RDI[0xba] = -1;
    in_RDI[0xbb] = '\x7f';
    in_RDI[0xbc] = '\0';
    in_RDI[0xbd] = '\0';
    in_RDI[0xbe] = '\0';
    in_RDI[0xbf] = '\0';
    in_RDI[0x88] = '\0';
    in_RDI[0x89] = '\0';
    in_RDI[0x8a] = '\x01';
    in_RDI[0x8b] = '\0';
    in_RDI[0x8c] = '\0';
    in_RDI[0x8d] = '\0';
    in_RDI[0x8e] = '\0';
    in_RDI[0x8f] = '\0';
  }
  else {
    ERR_new();
    ERR_set_debug((char *)hmac,in_stack_fffffffffffffffc,in_RDI);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int drbg_hmac_new(PROV_DRBG *drbg)
{
    PROV_DRBG_HMAC *hmac;

    hmac = OPENSSL_secure_zalloc(sizeof(*hmac));
    if (hmac == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    drbg->data = hmac;
    /* See SP800-57 Part1 Rev4 5.6.1 Table 3 */
    drbg->max_entropylen = DRBG_MAX_LENGTH;
    drbg->max_noncelen = DRBG_MAX_LENGTH;
    drbg->max_perslen = DRBG_MAX_LENGTH;
    drbg->max_adinlen = DRBG_MAX_LENGTH;

    /* Maximum number of bits per request = 2^19  = 2^16 bytes */
    drbg->max_request = 1 << 16;
    return 1;
}